

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_user(Curl_easy *data,connectdata *conn)

{
  byte *pbVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  pcVar3 = "";
  if (conn->user != (char *)0x0) {
    pcVar3 = conn->user;
  }
  CVar2 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"USER %s",pcVar3);
  if (CVar2 == CURLE_OK) {
    pbVar1 = (byte *)((long)&conn->proto + 0xf0);
    *pbVar1 = *pbVar1 & 0xfe;
    (data->conn->proto).ftpc.state = FTP_USER;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_user(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = Curl_pp_sendf(data,
                                  &conn->proto.ftpc.pp, "USER %s",
                                  conn->user?conn->user:"");
  if(!result) {
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    ftpc->ftp_trying_alternative = FALSE;
    state(data, FTP_USER);
  }
  return result;
}